

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O1

int ARKBBDPrecReInit(void *arkode_mem,sunindextype mudq,sunindextype mldq,sunrealtype dqrely)

{
  double __x;
  long *plVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKodeMem local_38;
  double local_30;
  ARKLsMem local_28;
  
  local_30 = dqrely;
  iVar3 = arkLs_AccessARKODELMem(arkode_mem,"ARKBBDPrecReInit",&local_38,&local_28);
  if (iVar3 == 0) {
    plVar1 = (long *)local_28->P_data;
    if (plVar1 == (long *)0x0) {
      iVar3 = -5;
      arkProcessError(local_38,-5,0x133,"ARKBBDPrecReInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                      ,"BBD peconditioner memory is NULL. ARKBBDPrecInit must be called.");
    }
    else {
      lVar2 = plVar1[0xf];
      iVar3 = 0;
      if (mudq < 1) {
        mudq = 0;
      }
      if (lVar2 <= mudq) {
        mudq = lVar2 + -1;
      }
      if (mldq < 1) {
        mldq = 0;
      }
      *plVar1 = mudq;
      if (lVar2 <= mldq) {
        mldq = lVar2 + -1;
      }
      plVar1[1] = mldq;
      dVar4 = local_30;
      if (local_30 <= 0.0) {
        __x = local_38->uround;
        dVar4 = 0.0;
        if (0.0 < __x) {
          if (__x < 0.0) {
            dVar4 = sqrt(__x);
          }
          else {
            dVar4 = SQRT(__x);
          }
        }
      }
      plVar1[4] = (long)dVar4;
      plVar1[0x12] = 0;
    }
  }
  return iVar3;
}

Assistant:

int ARKBBDPrecReInit(void* arkode_mem, sunindextype mudq, sunindextype mldq,
                     sunrealtype dqrely)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBBDPrecData pdata;
  sunindextype Nlocal;
  int retval;

  /* access ARKodeMem and ARKLsMem structure */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately ARKBBDPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BBD_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBBDPrecData)arkls_mem->P_data;

  /* Load half-bandwidths */
  Nlocal      = pdata->n_local;
  pdata->mudq = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));

  /* Set dqrely based on input dqrely (0 implies default). */
  pdata->dqrely = (dqrely > ZERO) ? dqrely : SUNRsqrt(ark_mem->uround);

  /* Re-initialize nge */
  pdata->nge = 0;

  return (ARKLS_SUCCESS);
}